

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  undefined8 *puVar2;
  thread *ptVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  size_t i_1;
  long lVar6;
  char _C;
  ofstream *local_2d8;
  string key;
  string fpath;
  string main_folder;
  string f;
  string local_250;
  ofstream ofile;
  
  fpath._M_dataplus._M_p = (pointer)&fpath.field_2;
  fpath._M_string_length = 0;
  fpath.field_2._M_local_buf[0] = '\0';
  if (argc < 2) {
    std::mutex::lock(&mu);
    poVar1 = std::operator<<((ostream *)&std::cout,"[Output] You can open file(s) with this program"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    pthread_mutex_unlock((pthread_mutex_t *)&mu);
    std::mutex::lock(&mu);
    poVar1 = std::operator<<((ostream *)&std::cout,"[Output] Or drag\'n\'drop on it");
    std::endl<char,std::char_traits<char>>(poVar1);
    pthread_mutex_unlock((pthread_mutex_t *)&mu);
    std::mutex::lock(&mu);
    std::operator<<((ostream *)&std::cout,"[Input] Enter filename(without spaces): ");
    pthread_mutex_unlock((pthread_mutex_t *)&mu);
    std::operator>>((istream *)&std::cin,(string *)&fpath);
  }
  else {
    std::__cxx11::string::assign((char *)&fpath);
  }
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  key.field_2._M_local_buf[0] = '\0';
  std::operator<<((ostream *)&std::cout,"[Input] Enter key(max 16 symbols): ");
  std::operator>>((istream *)&std::cin,(string *)&key);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  f._M_dataplus._M_p = (pointer)&f.field_2;
  f._M_string_length = 0;
  main_folder._M_dataplus._M_p = (pointer)&main_folder.field_2;
  main_folder._M_string_length = 0;
  f.field_2._M_local_buf[0] = '\0';
  main_folder.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&ofile,*argv,(allocator *)&_C);
  getFileName(&local_250,(string *)&ofile,&main_folder);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&ofile);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_C,
                 &main_folder,"encoder.log");
  std::ofstream::ofstream(&ofile,(string *)&_C,_S_out|_S_app);
  std::__cxx11::string::~string((string *)&_C);
  poVar1 = std::operator<<((ostream *)&std::cout,"[Output] Logging into: ");
  poVar1 = std::operator<<(poVar1,"encoder.log");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (argc < 2) {
    puVar2 = (undefined8 *)operator_new__(8);
    ptVar3 = (thread *)operator_new(8);
    __C = (pointer)&ofile;
    std::thread::
    thread<bool(&)(std::__cxx11::string,std::__cxx11::string,std::ofstream*),std::__cxx11::string&,std::__cxx11::string&,std::ofstream*,void>
              (ptVar3,encodeFile,&fpath,&key,(basic_ofstream<char,_std::char_traits<char>_> **)&_C);
    *puVar2 = ptVar3;
    std::thread::join();
  }
  else {
    uVar4 = (ulong)(argc - 1);
    puVar2 = (undefined8 *)operator_new__(uVar4 * 8);
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      std::__cxx11::string::string((string *)&_C,argv[uVar5 + 1],(allocator *)&local_2d8);
      ptVar3 = (thread *)operator_new(8);
      local_2d8 = &ofile;
      std::thread::
      thread<bool(&)(std::__cxx11::string,std::__cxx11::string,std::ofstream*),std::__cxx11::string&,std::__cxx11::string&,std::ofstream*,void>
                (ptVar3,encodeFile,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_C,&key,
                 (basic_ofstream<char,_std::char_traits<char>_> **)&local_2d8);
      puVar2[uVar5] = ptVar3;
      std::__cxx11::string::~string((string *)&_C);
    }
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      std::thread::join();
    }
  }
  for (lVar6 = 0; argc + -1 != lVar6; lVar6 = lVar6 + 1) {
    ptVar3 = (thread *)puVar2[lVar6];
    if (ptVar3 != (thread *)0x0) {
      std::thread::~thread(ptVar3);
    }
    operator_delete(ptVar3,8);
  }
  operator_delete__(puVar2);
  std::ofstream::close();
  std::operator>>((istream *)&std::cin,&_C);
  std::ofstream::~ofstream(&ofile);
  std::__cxx11::string::~string((string *)&main_folder);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::string::~string((string *)&fpath);
  return 0;
}

Assistant:

int main(const int argc, const char* argv[]) {
    //path
    std::string fpath;
    if (argc>1) {
        fpath.assign(argv[1]);
    } else {
        mu.lock(); std::cout << "[Output] You can open file(s) with this program" << std::endl; mu.unlock();
        mu.lock(); std::cout << "[Output] Or drag'n'drop on it" << std::endl; mu.unlock();
        mu.lock(); std::cout << "[Input] Enter filename(without spaces): "; mu.unlock();
        std::cin >> fpath;
    }

    //key reader
    std::string key;
    std::cout << "[Input] Enter key(max 16 symbols): ";
    std::cin >> key;
    std::cout << std::endl;

    std::string f, main_folder;
    getFileName(argv[0], &main_folder);
    std::ofstream ofile(main_folder+LOG_FILENAME, std::ios::out | std::ios::app);
    std::cout << "[Output] Logging into: " << LOG_FILENAME << std::endl;

    std::thread** threads;
    if (argc>1) {
        threads = new std::thread*[argc-1];
        for (int i=0; i<argc-1; i++) {
            std::string tfpath(argv[i+1]);
            std::thread* t  = new std::thread(encodeFile, tfpath, key, &ofile);
            threads[i] = t;
        }
        for (int i=0; i<argc-1; i++) {
            threads[i]->join();
        }
    } else {
        threads = new std::thread*[1];
        std::thread* t = new std::thread(encodeFile, fpath, key, &ofile);
        threads[0] = t;
        t->join();
    }

    for (size_t i=0; i<argc-1; i++) {
        delete threads[i];
    }
    delete[] threads;

    ofile.close();
    char _C; std::cin >> _C;            //breakpoint
    return 0;
}